

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.cpp
# Opt level: O2

string_t __thiscall
duckdb::NumericHelper::FormatSigned<duckdb::hugeint_t>
          (NumericHelper *this,hugeint_t value,Vector *vector)

{
  hugeint_t value_00;
  int iVar1;
  Vector *pVVar2;
  char *pcVar3;
  Vector *vector_00;
  Vector *extraout_RDX;
  idx_t len;
  uint64_t uVar4;
  uint val;
  anon_struct_16_3_d7536bce_for_pointer aVar5;
  hugeint_t value_01;
  hugeint_t local_40;
  anon_union_16_2_67f50693_for_value local_30;
  
  vector_00 = (Vector *)value.upper;
  uVar4 = value.lower;
  pVVar2 = vector_00;
  local_40.lower = (uint64_t)this;
  local_40.upper = uVar4;
  if ((long)uVar4 < 0) {
    if (this == (NumericHelper *)0x0 && uVar4 == 0x8000000000000000) {
      aVar5 = (anon_struct_16_3_d7536bce_for_pointer)
              StringVector::AddString(vector_00,"-170141183460469231731687303715884105728");
      return (string_t)aVar5;
    }
    Hugeint::NegateInPlace<true>(&local_40);
    pVVar2 = extraout_RDX;
  }
  value_01.upper = (int64_t)pVVar2;
  value_01.lower = local_40.upper;
  iVar1 = UnsignedLength<duckdb::hugeint_t>((NumericHelper *)local_40.lower,value_01);
  val = iVar1 - (value.lower._4_4_ >> 0x1f);
  pVVar2 = (Vector *)NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  local_30.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString((StringVector *)vector_00,pVVar2,len);
  pcVar3 = local_30.pointer.ptr;
  if (local_30.pointer.length < 0xd) {
    pcVar3 = local_30.pointer.prefix;
  }
  value_00.upper = local_40.upper;
  value_00.lower = local_40.lower;
  if (local_40.upper == 0) {
    pcVar3 = FormatUnsigned<unsigned_long>(local_40.lower,pcVar3 + val);
  }
  else {
    pcVar3 = FormatUnsigned<duckdb::hugeint_t>(value_00,pcVar3 + val);
  }
  if ((long)uVar4 < 0) {
    pcVar3[-1] = '-';
  }
  string_t::Finalize((string_t *)&local_30.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_30.pointer;
}

Assistant:

string_t NumericHelper::FormatSigned(hugeint_t value, Vector &vector) {
	int negative = value.upper < 0;
	if (negative) {
		if (value == NumericLimits<hugeint_t>::Minimum()) {
			string_t result = StringVector::AddString(vector, Hugeint::HUGEINT_MINIMUM_STRING);
			return result;
		}
		Hugeint::NegateInPlace(value);
	}
	int length = UnsignedLength(value) + negative;
	string_t result = StringVector::EmptyString(vector, NumericCast<size_t>(length));
	auto dataptr = result.GetDataWriteable();
	auto endptr = dataptr + length;
	if (value.upper == 0) {
		// small value: format as uint64_t
		endptr = NumericHelper::FormatUnsigned<uint64_t>(value.lower, endptr);
	} else {
		endptr = FormatUnsigned(value, endptr);
	}
	if (negative) {
		*--endptr = '-';
	}
	D_ASSERT(endptr == dataptr);
	result.Finalize();
	return result;
}